

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

unsigned_long
libssh2_channel_window_read_ex
          (LIBSSH2_CHANNEL *channel,unsigned_long *read_avail,unsigned_long *window_size_initial)

{
  char cVar1;
  uint32_t uVar2;
  list_node *plVar3;
  list_node *plStack_40;
  uchar packet_type;
  LIBSSH2_PACKET *packet;
  LIBSSH2_PACKET *next_packet;
  size_t bytes_queued;
  unsigned_long *window_size_initial_local;
  unsigned_long *read_avail_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0x0;
  }
  else {
    if (window_size_initial != (unsigned_long *)0x0) {
      *window_size_initial = (ulong)(channel->remote).window_size_initial;
    }
    if (read_avail != (unsigned_long *)0x0) {
      next_packet = (LIBSSH2_PACKET *)0x0;
      plVar3 = (list_node *)_libssh2_list_first(&channel->session->packets);
      while (plStack_40 = plVar3, plStack_40 != (list_node *)0x0) {
        plVar3 = (list_node *)_libssh2_list_next(plStack_40);
        if (((plStack_40[1].prev != (list_node *)0x0) &&
            (((cVar1 = *(char *)&(plStack_40[1].next)->next, cVar1 == '^' || (cVar1 == '_')) &&
             ((list_node *)0x4 < plStack_40[1].prev)))) &&
           (uVar2 = _libssh2_ntohu32((uchar *)((long)&(plStack_40[1].next)->next + 1)),
           uVar2 == (channel->local).id)) {
          next_packet = (LIBSSH2_PACKET *)
                        (((long)plStack_40[1].prev - (long)plStack_40[1].head) + (long)next_packet);
        }
      }
      *read_avail = (unsigned_long)next_packet;
    }
    channel_local = (LIBSSH2_CHANNEL *)(ulong)(channel->remote).window_size;
  }
  return (unsigned_long)channel_local;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_window_read_ex(LIBSSH2_CHANNEL *channel,
        /* FIXME: -> size_t */ unsigned long *read_avail,
                               unsigned long *window_size_initial)
{
    if(!channel)
        return 0; /* no channel, no window! */

    if(window_size_initial) {
        *window_size_initial = channel->remote.window_size_initial;
    }

    if(read_avail) {
        size_t bytes_queued = 0;
        LIBSSH2_PACKET *next_packet;
        LIBSSH2_PACKET *packet =
            _libssh2_list_first(&channel->session->packets);

        while(packet) {
            unsigned char packet_type;
               next_packet = _libssh2_list_next(&packet->node);

            if(packet->data_len < 1) {
                packet = next_packet;
                _libssh2_debug((channel->session, LIBSSH2_TRACE_ERROR,
                               "Unexpected packet length"));
                continue;
            }

            packet_type = packet->data[0];

            if(((packet_type == SSH_MSG_CHANNEL_DATA)
                || (packet_type == SSH_MSG_CHANNEL_EXTENDED_DATA))
               && ((packet->data_len >= 5)
                   && (_libssh2_ntohu32(packet->data + 1) ==
                       channel->local.id))) {
                bytes_queued += packet->data_len - packet->data_head;
            }

            packet = next_packet;
        }

        *read_avail = (unsigned long)bytes_queued;
    }

    return channel->remote.window_size;
}